

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

double house(double *x,int N,double *v)

{
  double dVar1;
  double *C;
  ulong uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  double dVar5;
  double dVar6;
  
  C = (double *)malloc(8);
  if (N < 2) {
    *v = 1.0;
    uVar3 = SUB84(*x,0);
    uVar4 = (undefined4)((ulong)*x >> 0x20);
    dVar6 = 0.0;
LAB_0011e5c4:
    dVar5 = 0.0;
    if (0.0 <= (double)CONCAT44(uVar4,uVar3)) goto LAB_0011e68e;
    if ((double)CONCAT44(uVar4,uVar3) <= 0.0 && (double)CONCAT44(uVar4,uVar3) != 0.0) {
      dVar5 = -2.0;
      goto LAB_0011e68e;
    }
  }
  else {
    mmult(x + 1,x + 1,C,1,N + -1,1);
    *v = 1.0;
    uVar2 = 1;
    do {
      v[uVar2] = x[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)N != uVar2);
    dVar6 = *C;
    uVar3 = SUB84(*x,0);
    uVar4 = (undefined4)((ulong)*x >> 0x20);
    if ((dVar6 == 0.0) && (!NAN(dVar6))) goto LAB_0011e5c4;
  }
  dVar5 = (double)CONCAT44(uVar4,uVar3) * (double)CONCAT44(uVar4,uVar3) + dVar6;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  dVar1 = *x;
  dVar1 = (double)(-(ulong)(0.0 < dVar1) & (ulong)(-dVar6 / (dVar5 + dVar1)) |
                  ~-(ulong)(0.0 < dVar1) & (ulong)(dVar1 - dVar5));
  *v = dVar1;
  dVar5 = ((dVar1 + dVar1) * dVar1) / (dVar1 * dVar1 + dVar6);
  if (0 < N) {
    uVar2 = 0;
    do {
      v[uVar2] = v[uVar2] / dVar1;
      uVar2 = uVar2 + 1;
    } while ((uint)N != uVar2);
  }
LAB_0011e68e:
  free(C);
  return dVar5;
}

Assistant:

double house(double*x,int N,double *v) {
	double beta;
	beta = house_1(x,N,v);
	return beta;
}